

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

run_container_t * run_container_create_range(uint32_t start,uint32_t stop)

{
  int iVar1;
  run_container_t *prVar2;
  
  prVar2 = run_container_create_given_capacity(1);
  if (prVar2 != (run_container_t *)0x0) {
    iVar1 = prVar2->n_runs;
    prVar2->runs[iVar1] = (rle16_t)(start & 0xffff | (~start + stop) * 0x10000);
    prVar2->n_runs = iVar1 + 1;
  }
  return prVar2;
}

Assistant:

static inline run_container_t *run_container_create_range(uint32_t start,
                                                          uint32_t stop) {
    run_container_t *rc = run_container_create_given_capacity(1);
    if (rc) {
        rle16_t r;
        r.value = (uint16_t)start;
        r.length = (uint16_t)(stop - start - 1);
        run_container_append_first(rc, r);
    }
    return rc;
}